

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O3

void __thiscall
prevector<28U,_unsigned_char,_unsigned_int,_int>::resize
          (prevector<28U,_unsigned_char,_unsigned_int,_int> *this,size_type new_size)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  size_type sVar4;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar5;
  uint uVar6;
  uint uVar7;
  size_t __len;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = this->_size;
  uVar3 = uVar1 - 0x1d;
  if (uVar1 < 0x1d) {
    uVar3 = uVar1;
  }
  uVar7 = new_size - uVar3;
  if (uVar7 != 0) {
    if (new_size < uVar3) {
      sVar4 = (uVar1 + new_size) - uVar3;
    }
    else {
      uVar6 = 0x1c;
      if (0x1c < uVar1) {
        uVar6 = (this->_union).indirect_contents.capacity;
      }
      if (uVar6 < new_size) {
        change_capacity(this,new_size);
      }
      ppVar5 = this;
      if (0x1c < this->_size) {
        ppVar5 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                 (this->_union).indirect_contents.indirect;
      }
      memset((void *)((long)&ppVar5->_union + (long)(int)uVar3),0,(ulong)uVar7);
      sVar4 = uVar7 + this->_size;
    }
    this->_size = sVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

bool is_direct() const { return _size <= N; }